

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O2

void __thiscall Assimp::Collada::Mesh::~Mesh(Mesh *this)

{
  long lVar1;
  
  std::vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>::~vector
            (&this->mSubMeshes);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->mFacePosIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  lVar1 = 0x220;
  do {
    std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
              ((_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
               ((long)&(this->mName)._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0x160);
  lVar1 = 0x160;
  do {
    std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
              ((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               ((long)&(this->mName)._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0xa0);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->mBitangents).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->mTangents).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->mNormals).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->mPositions).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
  ~vector(&this->mPerVertexData);
  std::__cxx11::string::~string((string *)&this->mVertexID);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Mesh()
    {
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)
            mNumUVComponents[i] = 2;
    }